

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_horizontal_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  byte bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined8 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  long lVar69;
  uint16_t *puVar70;
  ulong uVar71;
  uint16_t *puVar72;
  long lVar73;
  undefined4 uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar82;
  undefined1 auVar83 [16];
  short sVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ushort uVar88;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ushort uVar101;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  short sVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  short sVar135;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  undefined1 auVar136 [16];
  short sVar143;
  __m128i p [7];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i flat2_p [6];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  undefined1 local_2d8 [16];
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  undefined1 local_298 [16];
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  undefined1 local_268 [16];
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  undefined1 local_228 [16];
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  ushort local_208;
  ushort uStack_206;
  ushort uStack_204;
  ushort uStack_202;
  ushort uStack_200;
  ushort uStack_1fe;
  ushort uStack_1fc;
  ushort uStack_1fa;
  ushort local_1f8;
  ushort uStack_1f6;
  ushort uStack_1f4;
  ushort uStack_1f2;
  ushort uStack_1f0;
  ushort uStack_1ee;
  ushort uStack_1ec;
  ushort uStack_1ea;
  undefined1 local_1e8 [16];
  ushort local_1d8;
  ushort uStack_1d6;
  ushort uStack_1d4;
  ushort uStack_1d2;
  ushort uStack_1d0;
  ushort uStack_1ce;
  ushort uStack_1cc;
  ushort uStack_1ca;
  ushort local_1c8;
  ushort uStack_1c6;
  ushort uStack_1c4;
  ushort uStack_1c2;
  ushort uStack_1c0;
  ushort uStack_1be;
  ushort uStack_1bc;
  ushort uStack_1ba;
  undefined1 local_1b8 [16];
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  ushort local_d8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  ushort local_98;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  ushort uStack_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  __m128i qs [2];
  __m128i ps [2];
  
  lVar69 = (long)pitch;
  puVar72 = s + -lVar69;
  lVar73 = 0;
  puVar70 = s;
  do {
    uVar49 = *(undefined8 *)(puVar72 + 4);
    *(undefined8 *)((long)&local_288 + lVar73) = *(undefined8 *)puVar72;
    *(undefined8 *)((long)&sStack_280 + lVar73) = uVar49;
    uVar49 = *(undefined8 *)(puVar70 + 4);
    *(undefined8 *)((long)&local_2f8 + lVar73) = *(undefined8 *)puVar70;
    *(undefined8 *)((long)&sStack_2f0 + lVar73) = uVar49;
    lVar73 = lVar73 + 0x10;
    puVar70 = puVar70 + lVar69;
    puVar72 = puVar72 + -lVar69;
  } while (lVar73 != 0x70);
  auVar83 = *(undefined1 (*) [16])_blimit0;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar83._0_13_;
  auVar7[0xe] = auVar83[7];
  auVar13[0xc] = auVar83[6];
  auVar13._0_12_ = auVar83._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar83._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar83[5];
  auVar25._0_10_ = auVar83._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar83._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar83[4];
  auVar37._0_8_ = auVar83._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar37._8_7_;
  auVar57._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar57[0] = auVar83[3];
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = auVar83[2];
  auVar58._11_4_ = 0;
  auVar48._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar48[2] = auVar83[1];
  auVar48[1] = 0;
  auVar48[0] = auVar83[0];
  auVar83 = *(undefined1 (*) [16])_blimit1;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar83._0_13_;
  auVar2[0xe] = auVar83[7];
  auVar8[0xc] = auVar83[6];
  auVar8._0_12_ = auVar83._0_12_;
  auVar8._13_2_ = auVar2._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar83._0_11_;
  auVar14._12_3_ = auVar8._12_3_;
  auVar20[10] = auVar83[5];
  auVar20._0_10_ = auVar83._0_10_;
  auVar20._11_4_ = auVar14._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar83._0_9_;
  auVar26._10_5_ = auVar20._10_5_;
  auVar32[8] = auVar83[4];
  auVar32._0_8_ = auVar83._0_8_;
  auVar32._9_6_ = auVar26._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar32._8_7_;
  auVar59._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar59[0] = auVar83[3];
  auVar59._9_6_ = 0;
  auVar60._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar60[0] = auVar83[2];
  auVar60._11_4_ = 0;
  auVar38[2] = auVar83[1];
  auVar38._0_2_ = auVar83._0_2_;
  auVar38._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar43._2_13_ = auVar38._2_13_;
  auVar43._0_2_ = auVar83._0_2_ & 0xff;
  auVar75._0_8_ = auVar48._0_8_;
  auVar75._8_8_ = auVar43._0_8_;
  auVar79 = ZEXT416(bd - 8);
  auVar75 = psllw(auVar75,auVar79);
  auVar83 = *(undefined1 (*) [16])_limit0;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar83._0_13_;
  auVar3[0xe] = auVar83[7];
  auVar9[0xc] = auVar83[6];
  auVar9._0_12_ = auVar83._0_12_;
  auVar9._13_2_ = auVar3._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar83._0_11_;
  auVar15._12_3_ = auVar9._12_3_;
  auVar21[10] = auVar83[5];
  auVar21._0_10_ = auVar83._0_10_;
  auVar21._11_4_ = auVar15._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar83._0_9_;
  auVar27._10_5_ = auVar21._10_5_;
  auVar33[8] = auVar83[4];
  auVar33._0_8_ = auVar83._0_8_;
  auVar33._9_6_ = auVar27._9_6_;
  auVar53._7_8_ = 0;
  auVar53._0_7_ = auVar33._8_7_;
  auVar61._1_8_ = SUB158(auVar53 << 0x40,7);
  auVar61[0] = auVar83[3];
  auVar61._9_6_ = 0;
  auVar62._1_10_ = SUB1510(auVar61 << 0x30,5);
  auVar62[0] = auVar83[2];
  auVar62._11_4_ = 0;
  auVar39[2] = auVar83[1];
  auVar39._0_2_ = auVar83._0_2_;
  auVar39._3_12_ = SUB1512(auVar62 << 0x20,3);
  auVar44._2_13_ = auVar39._2_13_;
  auVar44._0_2_ = auVar83._0_2_ & 0xff;
  auVar83 = *(undefined1 (*) [16])_limit1;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar83._0_13_;
  auVar4[0xe] = auVar83[7];
  auVar10[0xc] = auVar83[6];
  auVar10._0_12_ = auVar83._0_12_;
  auVar10._13_2_ = auVar4._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar83._0_11_;
  auVar16._12_3_ = auVar10._12_3_;
  auVar22[10] = auVar83[5];
  auVar22._0_10_ = auVar83._0_10_;
  auVar22._11_4_ = auVar16._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar83._0_9_;
  auVar28._10_5_ = auVar22._10_5_;
  auVar34[8] = auVar83[4];
  auVar34._0_8_ = auVar83._0_8_;
  auVar34._9_6_ = auVar28._9_6_;
  auVar54._7_8_ = 0;
  auVar54._0_7_ = auVar34._8_7_;
  auVar63._1_8_ = SUB158(auVar54 << 0x40,7);
  auVar63[0] = auVar83[3];
  auVar63._9_6_ = 0;
  auVar64._1_10_ = SUB1510(auVar63 << 0x30,5);
  auVar64[0] = auVar83[2];
  auVar64._11_4_ = 0;
  auVar40[2] = auVar83[1];
  auVar40._0_2_ = auVar83._0_2_;
  auVar40._3_12_ = SUB1512(auVar64 << 0x20,3);
  auVar45._2_13_ = auVar40._2_13_;
  auVar45._0_2_ = auVar83._0_2_ & 0xff;
  auVar90._0_8_ = auVar44._0_8_;
  auVar90._8_8_ = auVar45._0_8_;
  auVar120 = psllw(auVar90,auVar79);
  auVar83 = *(undefined1 (*) [16])_thresh0;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar83._0_13_;
  auVar5[0xe] = auVar83[7];
  auVar11[0xc] = auVar83[6];
  auVar11._0_12_ = auVar83._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar83._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar83[5];
  auVar23._0_10_ = auVar83._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar83._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar83[4];
  auVar35._0_8_ = auVar83._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar55._7_8_ = 0;
  auVar55._0_7_ = auVar35._8_7_;
  auVar65._1_8_ = SUB158(auVar55 << 0x40,7);
  auVar65[0] = auVar83[3];
  auVar65._9_6_ = 0;
  auVar66._1_10_ = SUB1510(auVar65 << 0x30,5);
  auVar66[0] = auVar83[2];
  auVar66._11_4_ = 0;
  auVar41[2] = auVar83[1];
  auVar41._0_2_ = auVar83._0_2_;
  auVar41._3_12_ = SUB1512(auVar66 << 0x20,3);
  auVar46._2_13_ = auVar41._2_13_;
  auVar46._0_2_ = auVar83._0_2_ & 0xff;
  auVar83 = *(undefined1 (*) [16])_thresh1;
  bVar1 = (char)bd - 1U & 0x1f;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar83._0_13_;
  auVar6[0xe] = auVar83[7];
  auVar12[0xc] = auVar83[6];
  auVar12._0_12_ = auVar83._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar83._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar83[5];
  auVar24._0_10_ = auVar83._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar83._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar83[4];
  auVar36._0_8_ = auVar83._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar56._7_8_ = 0;
  auVar56._0_7_ = auVar36._8_7_;
  auVar67._1_8_ = SUB158(auVar56 << 0x40,7);
  auVar67[0] = auVar83[3];
  auVar67._9_6_ = 0;
  auVar68._1_10_ = SUB1510(auVar67 << 0x30,5);
  auVar68[0] = auVar83[2];
  auVar68._11_4_ = 0;
  auVar42[2] = auVar83[1];
  auVar42._0_2_ = auVar83._0_2_;
  auVar42._3_12_ = SUB1512(auVar68 << 0x20,3);
  auVar47._2_13_ = auVar42._2_13_;
  auVar47._0_2_ = auVar83._0_2_ & 0xff;
  auVar125._0_8_ = auVar46._0_8_;
  auVar125._8_8_ = auVar47._0_8_;
  auVar102._2_2_ = sStack_286;
  auVar102._0_2_ = local_288;
  auVar102._4_2_ = sStack_284;
  auVar102._6_2_ = sStack_282;
  auVar102._8_2_ = sStack_280;
  auVar102._10_2_ = sStack_27e;
  auVar102._12_2_ = sStack_27c;
  auVar102._14_2_ = sStack_27a;
  auVar134._2_2_ = sStack_276;
  auVar134._0_2_ = local_278;
  auVar134._4_2_ = sStack_274;
  auVar134._6_2_ = sStack_272;
  auVar134._8_2_ = sStack_270;
  auVar134._10_2_ = sStack_26e;
  auVar134._12_2_ = sStack_26c;
  auVar134._14_2_ = sStack_26a;
  auVar83._2_2_ = sStack_2f6;
  auVar83._0_2_ = local_2f8;
  auVar83._4_2_ = sStack_2f4;
  auVar83._6_2_ = sStack_2f2;
  auVar83._8_2_ = sStack_2f0;
  auVar83._10_2_ = sStack_2ee;
  auVar83._12_2_ = sStack_2ec;
  auVar83._14_2_ = sStack_2ea;
  auVar133._2_2_ = sStack_2e6;
  auVar133._0_2_ = local_2e8;
  auVar133._4_2_ = sStack_2e4;
  auVar133._6_2_ = sStack_2e2;
  auVar133._8_2_ = sStack_2e0;
  auVar133._10_2_ = sStack_2de;
  auVar133._12_2_ = sStack_2dc;
  auVar133._14_2_ = sStack_2da;
  auVar89 = psubusw(auVar102,auVar83);
  auVar115 = psubusw(auVar83,auVar102);
  auVar90 = psubusw(auVar134,auVar133);
  auVar124 = psubusw(auVar133,auVar134);
  auVar124 = auVar124 | auVar90;
  auVar89 = paddusw(auVar115 | auVar89,auVar115 | auVar89);
  auVar115._0_2_ = auVar124._0_2_ >> 1;
  auVar115._2_2_ = auVar124._2_2_ >> 1;
  auVar115._4_2_ = auVar124._4_2_ >> 1;
  auVar115._6_2_ = auVar124._6_2_ >> 1;
  auVar115._8_2_ = auVar124._8_2_ >> 1;
  auVar115._10_2_ = auVar124._10_2_ >> 1;
  auVar115._12_2_ = auVar124._12_2_ >> 1;
  auVar115._14_2_ = auVar124._14_2_ >> 1;
  auVar89 = paddusw(auVar115,auVar89);
  auVar89 = auVar89 ^ _DAT_004dcf60;
  auVar75 = auVar75 ^ _DAT_004dcf60;
  auVar124._0_2_ = -(ushort)(auVar75._0_2_ < auVar89._0_2_);
  auVar124._2_2_ = -(ushort)(auVar75._2_2_ < auVar89._2_2_);
  auVar124._4_2_ = -(ushort)(auVar75._4_2_ < auVar89._4_2_);
  auVar124._6_2_ = -(ushort)(auVar75._6_2_ < auVar89._6_2_);
  auVar124._8_2_ = -(ushort)(auVar75._8_2_ < auVar89._8_2_);
  auVar124._10_2_ = -(ushort)(auVar75._10_2_ < auVar89._10_2_);
  auVar124._12_2_ = -(ushort)(auVar75._12_2_ < auVar89._12_2_);
  auVar124._14_2_ = -(ushort)(auVar75._14_2_ < auVar89._14_2_);
  auVar89 = paddusw(_DAT_00517600,auVar120);
  auVar89 = auVar89 & auVar124;
  lVar73 = 0x10;
  do {
    auVar90 = psubusw(*(undefined1 (*) [16])((long)&local_288 + lVar73),
                      *(undefined1 (*) [16])(local_298 + lVar73));
    auVar75 = psubusw(*(undefined1 (*) [16])(local_298 + lVar73),
                      *(undefined1 (*) [16])((long)&local_288 + lVar73));
    auVar75 = auVar75 | auVar90;
    sVar104 = auVar89._0_2_;
    sVar105 = auVar75._0_2_;
    auVar76._0_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar89._2_2_;
    sVar105 = auVar75._2_2_;
    auVar76._2_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar89._4_2_;
    sVar105 = auVar75._4_2_;
    auVar76._4_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar89._6_2_;
    sVar105 = auVar75._6_2_;
    auVar76._6_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar89._8_2_;
    sVar105 = auVar75._8_2_;
    auVar76._8_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar89._10_2_;
    sVar105 = auVar75._10_2_;
    auVar76._10_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar89._12_2_;
    sVar105 = auVar75._12_2_;
    sVar106 = auVar75._14_2_;
    auVar76._12_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar89._14_2_;
    auVar76._14_2_ = (ushort)(sVar106 < sVar104) * sVar104 | (ushort)(sVar106 >= sVar104) * sVar106;
    auVar75 = psubusw(*(undefined1 (*) [16])((long)&local_2f8 + lVar73),
                      *(undefined1 (*) [16])(local_308 + lVar73));
    auVar90 = psubusw(*(undefined1 (*) [16])(local_308 + lVar73),
                      *(undefined1 (*) [16])((long)&local_2f8 + lVar73));
    auVar90 = auVar90 | auVar75;
    sVar104 = auVar90._0_2_;
    auVar89._0_2_ =
         (sVar104 < (short)auVar76._0_2_) * auVar76._0_2_ |
         (ushort)(sVar104 >= (short)auVar76._0_2_) * sVar104;
    sVar104 = auVar90._2_2_;
    auVar89._2_2_ =
         (sVar104 < (short)auVar76._2_2_) * auVar76._2_2_ |
         (ushort)(sVar104 >= (short)auVar76._2_2_) * sVar104;
    sVar104 = auVar90._4_2_;
    auVar89._4_2_ =
         (sVar104 < (short)auVar76._4_2_) * auVar76._4_2_ |
         (ushort)(sVar104 >= (short)auVar76._4_2_) * sVar104;
    sVar104 = auVar90._6_2_;
    auVar89._6_2_ =
         (sVar104 < (short)auVar76._6_2_) * auVar76._6_2_ |
         (ushort)(sVar104 >= (short)auVar76._6_2_) * sVar104;
    sVar104 = auVar90._8_2_;
    auVar89._8_2_ =
         (sVar104 < (short)auVar76._8_2_) * auVar76._8_2_ |
         (ushort)(sVar104 >= (short)auVar76._8_2_) * sVar104;
    sVar104 = auVar90._10_2_;
    auVar89._10_2_ =
         (sVar104 < (short)auVar76._10_2_) * auVar76._10_2_ |
         (ushort)(sVar104 >= (short)auVar76._10_2_) * sVar104;
    sVar104 = auVar90._12_2_;
    sVar105 = auVar90._14_2_;
    auVar89._12_2_ =
         (sVar104 < (short)auVar76._12_2_) * auVar76._12_2_ |
         (ushort)(sVar104 >= (short)auVar76._12_2_) * sVar104;
    auVar89._14_2_ =
         (sVar105 < (short)auVar76._14_2_) * auVar76._14_2_ |
         (ushort)(sVar105 >= (short)auVar76._14_2_) * sVar105;
    lVar73 = lVar73 + 0x10;
  } while (lVar73 != 0x40);
  auVar75 = pshuflw(auVar76,ZEXT416((uint)(1 << bVar1)),0);
  uVar74 = auVar75._0_4_;
  auVar114._4_4_ = uVar74;
  auVar114._0_4_ = uVar74;
  auVar114._8_4_ = uVar74;
  auVar114._12_4_ = uVar74;
  auVar75 = psubusw(auVar133,auVar83);
  auVar90 = psubusw(auVar83,auVar133);
  auVar90 = auVar90 | auVar75;
  auVar75 = psubusw(auVar134,auVar102);
  auVar115 = psubusw(auVar102,auVar134);
  auVar115 = auVar115 | auVar75;
  sVar104 = auVar90._0_2_;
  sVar105 = auVar115._0_2_;
  auVar116._0_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar90._2_2_;
  sVar105 = auVar115._2_2_;
  auVar116._2_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar90._4_2_;
  sVar105 = auVar115._4_2_;
  auVar116._4_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar90._6_2_;
  sVar105 = auVar115._6_2_;
  auVar116._6_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar90._8_2_;
  sVar105 = auVar115._8_2_;
  auVar116._8_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar90._10_2_;
  sVar105 = auVar115._10_2_;
  auVar116._10_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar90._12_2_;
  sVar105 = auVar115._12_2_;
  sVar106 = auVar115._14_2_;
  auVar116._12_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar90._14_2_;
  auVar116._14_2_ = (ushort)(sVar106 < sVar104) * sVar104 | (ushort)(sVar106 >= sVar104) * sVar106;
  lVar73 = 0x20;
  auVar77 = auVar116;
  do {
    auVar90 = psubusw(auVar102,*(undefined1 (*) [16])((long)&local_288 + lVar73));
    auVar75 = psubusw(*(undefined1 (*) [16])((long)&local_288 + lVar73),auVar102);
    auVar75 = auVar75 | auVar90;
    sVar104 = auVar77._0_2_;
    sVar105 = auVar75._0_2_;
    uVar88 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar77._2_2_;
    sVar105 = auVar75._2_2_;
    uVar95 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar77._4_2_;
    sVar105 = auVar75._4_2_;
    uVar96 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar77._6_2_;
    sVar105 = auVar75._6_2_;
    uVar97 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar77._8_2_;
    sVar105 = auVar75._8_2_;
    uVar98 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar77._10_2_;
    sVar105 = auVar75._10_2_;
    uVar99 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar77._12_2_;
    sVar105 = auVar75._12_2_;
    sVar106 = auVar75._14_2_;
    uVar100 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar77._14_2_;
    uVar101 = (ushort)(sVar106 < sVar104) * sVar104 | (ushort)(sVar106 >= sVar104) * sVar106;
    auVar90 = psubusw(auVar83,*(undefined1 (*) [16])((long)&local_2f8 + lVar73));
    auVar75 = psubusw(*(undefined1 (*) [16])((long)&local_2f8 + lVar73),auVar83);
    auVar75 = auVar75 | auVar90;
    sVar104 = auVar75._0_2_;
    auVar77._0_2_ =
         (sVar104 < (short)uVar88) * uVar88 | (ushort)(sVar104 >= (short)uVar88) * sVar104;
    sVar104 = auVar75._2_2_;
    auVar77._2_2_ =
         (sVar104 < (short)uVar95) * uVar95 | (ushort)(sVar104 >= (short)uVar95) * sVar104;
    sVar104 = auVar75._4_2_;
    auVar77._4_2_ =
         (sVar104 < (short)uVar96) * uVar96 | (ushort)(sVar104 >= (short)uVar96) * sVar104;
    sVar104 = auVar75._6_2_;
    auVar77._6_2_ =
         (sVar104 < (short)uVar97) * uVar97 | (ushort)(sVar104 >= (short)uVar97) * sVar104;
    sVar104 = auVar75._8_2_;
    auVar77._8_2_ =
         (sVar104 < (short)uVar98) * uVar98 | (ushort)(sVar104 >= (short)uVar98) * sVar104;
    sVar104 = auVar75._10_2_;
    auVar77._10_2_ =
         (sVar104 < (short)uVar99) * uVar99 | (ushort)(sVar104 >= (short)uVar99) * sVar104;
    sVar104 = auVar75._12_2_;
    sVar105 = auVar75._14_2_;
    auVar77._12_2_ =
         (sVar104 < (short)uVar100) * uVar100 | (ushort)(sVar104 >= (short)uVar100) * sVar104;
    auVar77._14_2_ =
         (sVar105 < (short)uVar101) * uVar101 | (ushort)(sVar105 >= (short)uVar101) * sVar105;
    lVar73 = lVar73 + 0x10;
  } while (lVar73 != 0x40);
  auVar90 = psllw(auVar125,auVar79);
  auVar125 = psllw(_DAT_00517600,auVar79);
  auVar79._2_2_ = sStack_2b6;
  auVar79._0_2_ = local_2b8;
  auVar79._4_2_ = sStack_2b4;
  auVar79._6_2_ = sStack_2b2;
  auVar79._8_2_ = sStack_2b0;
  auVar79._10_2_ = sStack_2ae;
  auVar79._12_2_ = sStack_2ac;
  auVar79._14_2_ = sStack_2aa;
  auVar75 = psubusw(auVar83,auVar79);
  auVar79 = psubusw(auVar79,auVar83);
  auVar79 = auVar79 | auVar75;
  auVar50._2_2_ = sStack_246;
  auVar50._0_2_ = local_248;
  auVar50._4_2_ = sStack_244;
  auVar50._6_2_ = sStack_242;
  auVar50._8_2_ = sStack_240;
  auVar50._10_2_ = sStack_23e;
  auVar50._12_2_ = sStack_23c;
  auVar50._14_2_ = sStack_23a;
  auVar115 = psubusw(auVar102,auVar50);
  auVar75 = psubusw(auVar50,auVar102);
  auVar75 = auVar75 | auVar115;
  sVar104 = auVar79._0_2_;
  sVar105 = auVar75._0_2_;
  auVar80._0_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar79._2_2_;
  sVar105 = auVar75._2_2_;
  auVar80._2_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar79._4_2_;
  sVar105 = auVar75._4_2_;
  auVar80._4_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar79._6_2_;
  sVar105 = auVar75._6_2_;
  auVar80._6_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar79._8_2_;
  sVar105 = auVar75._8_2_;
  auVar80._8_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar79._10_2_;
  sVar105 = auVar75._10_2_;
  auVar80._10_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar79._12_2_;
  sVar105 = auVar75._12_2_;
  sVar106 = auVar75._14_2_;
  auVar80._12_2_ = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
  sVar104 = auVar79._14_2_;
  auVar80._14_2_ = (ushort)(sVar106 < sVar104) * sVar104 | (ushort)(sVar106 >= sVar104) * sVar106;
  lVar73 = 0x50;
  do {
    auVar79 = psubusw(auVar102,*(undefined1 (*) [16])((long)&local_288 + lVar73));
    auVar75 = psubusw(*(undefined1 (*) [16])((long)&local_288 + lVar73),auVar102);
    auVar75 = auVar75 | auVar79;
    sVar104 = auVar80._0_2_;
    sVar105 = auVar75._0_2_;
    uVar88 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar80._2_2_;
    sVar105 = auVar75._2_2_;
    uVar95 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar80._4_2_;
    sVar105 = auVar75._4_2_;
    uVar96 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar80._6_2_;
    sVar105 = auVar75._6_2_;
    uVar97 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar80._8_2_;
    sVar105 = auVar75._8_2_;
    uVar98 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar80._10_2_;
    sVar105 = auVar75._10_2_;
    uVar99 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar80._12_2_;
    sVar105 = auVar75._12_2_;
    sVar106 = auVar75._14_2_;
    uVar100 = (ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105;
    sVar104 = auVar80._14_2_;
    uVar101 = (ushort)(sVar106 < sVar104) * sVar104 | (ushort)(sVar106 >= sVar104) * sVar106;
    auVar79 = psubusw(auVar83,*(undefined1 (*) [16])((long)&local_2f8 + lVar73));
    auVar75 = psubusw(*(undefined1 (*) [16])((long)&local_2f8 + lVar73),auVar83);
    auVar75 = auVar75 | auVar79;
    sVar104 = auVar75._0_2_;
    auVar80._0_2_ =
         (sVar104 < (short)uVar88) * uVar88 | (ushort)(sVar104 >= (short)uVar88) * sVar104;
    sVar104 = auVar75._2_2_;
    auVar80._2_2_ =
         (sVar104 < (short)uVar95) * uVar95 | (ushort)(sVar104 >= (short)uVar95) * sVar104;
    sVar104 = auVar75._4_2_;
    auVar80._4_2_ =
         (sVar104 < (short)uVar96) * uVar96 | (ushort)(sVar104 >= (short)uVar96) * sVar104;
    sVar104 = auVar75._6_2_;
    auVar80._6_2_ =
         (sVar104 < (short)uVar97) * uVar97 | (ushort)(sVar104 >= (short)uVar97) * sVar104;
    sVar104 = auVar75._8_2_;
    auVar80._8_2_ =
         (sVar104 < (short)uVar98) * uVar98 | (ushort)(sVar104 >= (short)uVar98) * sVar104;
    sVar104 = auVar75._10_2_;
    auVar80._10_2_ =
         (sVar104 < (short)uVar99) * uVar99 | (ushort)(sVar104 >= (short)uVar99) * sVar104;
    sVar104 = auVar75._12_2_;
    sVar105 = auVar75._14_2_;
    auVar80._12_2_ =
         (sVar104 < (short)uVar100) * uVar100 | (ushort)(sVar104 >= (short)uVar100) * sVar104;
    auVar80._14_2_ =
         (sVar105 < (short)uVar101) * uVar101 | (ushort)(sVar105 >= (short)uVar101) * sVar105;
    lVar73 = lVar73 + 0x10;
  } while (lVar73 != 0x70);
  auVar75 = psubusw(auVar89,auVar120);
  auVar119._0_2_ = -(ushort)(auVar75._0_2_ == 0);
  auVar119._2_2_ = -(ushort)(auVar75._2_2_ == 0);
  auVar119._4_2_ = -(ushort)(auVar75._4_2_ == 0);
  auVar119._6_2_ = -(ushort)(auVar75._6_2_ == 0);
  auVar119._8_2_ = -(ushort)(auVar75._8_2_ == 0);
  auVar119._10_2_ = -(ushort)(auVar75._10_2_ == 0);
  auVar119._12_2_ = -(ushort)(auVar75._12_2_ == 0);
  auVar119._14_2_ = -(ushort)(auVar75._14_2_ == 0);
  auVar75 = psubusw(auVar77,auVar125);
  auVar120._0_2_ = -(ushort)(auVar75._0_2_ == 0);
  auVar120._2_2_ = -(ushort)(auVar75._2_2_ == 0);
  auVar120._4_2_ = -(ushort)(auVar75._4_2_ == 0);
  auVar120._6_2_ = -(ushort)(auVar75._6_2_ == 0);
  auVar120._8_2_ = -(ushort)(auVar75._8_2_ == 0);
  auVar120._10_2_ = -(ushort)(auVar75._10_2_ == 0);
  auVar120._12_2_ = -(ushort)(auVar75._12_2_ == 0);
  auVar120._14_2_ = -(ushort)(auVar75._14_2_ == 0);
  auVar75 = psubsw(auVar102,auVar114);
  auVar79 = psubsw(auVar134,auVar114);
  auVar102 = psubsw(auVar83,auVar114);
  auVar83 = psubsw(auVar133,auVar114);
  auVar133 = psllw(_DAT_00517600,ZEXT416((uint)bd));
  auVar136._8_4_ = 0xffffffff;
  auVar136._0_8_ = 0xffffffffffffffff;
  auVar136._12_4_ = 0xffffffff;
  auVar133 = paddsw(auVar133,auVar136);
  auVar134 = psubsw(auVar133,auVar114);
  auVar89 = psubsw((undefined1  [16])0x0,auVar114);
  auVar133 = psubsw(auVar79,auVar83);
  sVar135 = auVar134._0_2_;
  sVar104 = auVar133._0_2_;
  uVar88 = (ushort)(sVar135 < sVar104) * sVar135 | (ushort)(sVar135 >= sVar104) * sVar104;
  sVar137 = auVar134._2_2_;
  sVar104 = auVar133._2_2_;
  uVar95 = (ushort)(sVar137 < sVar104) * sVar137 | (ushort)(sVar137 >= sVar104) * sVar104;
  sVar138 = auVar134._4_2_;
  sVar104 = auVar133._4_2_;
  uVar96 = (ushort)(sVar138 < sVar104) * sVar138 | (ushort)(sVar138 >= sVar104) * sVar104;
  sVar139 = auVar134._6_2_;
  sVar104 = auVar133._6_2_;
  uVar97 = (ushort)(sVar139 < sVar104) * sVar139 | (ushort)(sVar139 >= sVar104) * sVar104;
  sVar140 = auVar134._8_2_;
  sVar104 = auVar133._8_2_;
  uVar98 = (ushort)(sVar140 < sVar104) * sVar140 | (ushort)(sVar140 >= sVar104) * sVar104;
  sVar141 = auVar134._10_2_;
  sVar104 = auVar133._10_2_;
  uVar99 = (ushort)(sVar141 < sVar104) * sVar141 | (ushort)(sVar141 >= sVar104) * sVar104;
  sVar142 = auVar134._12_2_;
  sVar104 = auVar133._12_2_;
  sVar105 = auVar133._14_2_;
  uVar100 = (ushort)(sVar142 < sVar104) * sVar142 | (ushort)(sVar142 >= sVar104) * sVar104;
  sVar143 = auVar134._14_2_;
  uVar101 = (ushort)(sVar143 < sVar105) * sVar143 | (ushort)(sVar143 >= sVar105) * sVar105;
  sVar104 = auVar89._0_2_;
  auVar91._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88;
  sVar105 = auVar89._2_2_;
  auVar91._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95;
  sVar106 = auVar89._4_2_;
  auVar91._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96;
  sVar107 = auVar89._6_2_;
  auVar91._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97;
  sVar108 = auVar89._8_2_;
  auVar91._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98;
  sVar109 = auVar89._10_2_;
  auVar91._10_2_ = (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99
  ;
  sVar110 = auVar89._12_2_;
  auVar91._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  sVar111 = auVar89._14_2_;
  auVar91._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  auVar90 = auVar90 ^ _DAT_004dcf60;
  auVar116 = auVar116 ^ _DAT_004dcf60;
  auVar117._0_2_ = -(ushort)(auVar90._0_2_ < auVar116._0_2_);
  auVar117._2_2_ = -(ushort)(auVar90._2_2_ < auVar116._2_2_);
  auVar117._4_2_ = -(ushort)(auVar90._4_2_ < auVar116._4_2_);
  auVar117._6_2_ = -(ushort)(auVar90._6_2_ < auVar116._6_2_);
  auVar117._8_2_ = -(ushort)(auVar90._8_2_ < auVar116._8_2_);
  auVar117._10_2_ = -(ushort)(auVar90._10_2_ < auVar116._10_2_);
  auVar117._12_2_ = -(ushort)(auVar90._12_2_ < auVar116._12_2_);
  auVar117._14_2_ = -(ushort)(auVar90._14_2_ < auVar116._14_2_);
  auVar134 = psubsw(auVar102,auVar75);
  auVar133 = paddsw(auVar91 & auVar117,auVar134);
  auVar133 = paddsw(auVar133,auVar134);
  auVar133 = paddsw(auVar133,auVar134);
  sVar82 = auVar133._0_2_;
  uVar88 = (ushort)(sVar135 < sVar82) * sVar135 | (ushort)(sVar135 >= sVar82) * sVar82;
  sVar82 = auVar133._2_2_;
  uVar95 = (ushort)(sVar137 < sVar82) * sVar137 | (ushort)(sVar137 >= sVar82) * sVar82;
  sVar82 = auVar133._4_2_;
  uVar96 = (ushort)(sVar138 < sVar82) * sVar138 | (ushort)(sVar138 >= sVar82) * sVar82;
  sVar82 = auVar133._6_2_;
  uVar97 = (ushort)(sVar139 < sVar82) * sVar139 | (ushort)(sVar139 >= sVar82) * sVar82;
  sVar82 = auVar133._8_2_;
  uVar98 = (ushort)(sVar140 < sVar82) * sVar140 | (ushort)(sVar140 >= sVar82) * sVar82;
  sVar82 = auVar133._10_2_;
  uVar99 = (ushort)(sVar141 < sVar82) * sVar141 | (ushort)(sVar141 >= sVar82) * sVar82;
  sVar82 = auVar133._12_2_;
  sVar87 = auVar133._14_2_;
  uVar100 = (ushort)(sVar142 < sVar82) * sVar142 | (ushort)(sVar142 >= sVar82) * sVar82;
  uVar101 = (ushort)(sVar143 < sVar87) * sVar143 | (ushort)(sVar143 >= sVar87) * sVar87;
  auVar92._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88;
  auVar92._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95;
  auVar92._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96;
  auVar92._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97;
  auVar92._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98;
  auVar92._10_2_ = (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99
  ;
  auVar92._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  auVar92._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  auVar134 = paddsw(_DAT_0050bca0,auVar92 & auVar119);
  auVar133 = paddsw(auVar92 & auVar119,_DAT_00517620);
  auVar120 = auVar120 & auVar119;
  sVar82 = auVar134._0_2_;
  uVar88 = (ushort)(sVar135 < sVar82) * sVar135 | (ushort)(sVar135 >= sVar82) * sVar82;
  sVar82 = auVar134._2_2_;
  uVar95 = (ushort)(sVar137 < sVar82) * sVar137 | (ushort)(sVar137 >= sVar82) * sVar82;
  sVar82 = auVar134._4_2_;
  uVar96 = (ushort)(sVar138 < sVar82) * sVar138 | (ushort)(sVar138 >= sVar82) * sVar82;
  sVar82 = auVar134._6_2_;
  uVar97 = (ushort)(sVar139 < sVar82) * sVar139 | (ushort)(sVar139 >= sVar82) * sVar82;
  sVar82 = auVar134._8_2_;
  uVar98 = (ushort)(sVar140 < sVar82) * sVar140 | (ushort)(sVar140 >= sVar82) * sVar82;
  sVar82 = auVar134._10_2_;
  uVar99 = (ushort)(sVar141 < sVar82) * sVar141 | (ushort)(sVar141 >= sVar82) * sVar82;
  sVar82 = auVar134._12_2_;
  sVar87 = auVar134._14_2_;
  uVar100 = (ushort)(sVar142 < sVar82) * sVar142 | (ushort)(sVar142 >= sVar82) * sVar82;
  uVar101 = (ushort)(sVar143 < sVar87) * sVar143 | (ushort)(sVar143 >= sVar87) * sVar87;
  auVar112._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88
  ;
  auVar112._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95
  ;
  auVar112._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96
  ;
  auVar112._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97
  ;
  auVar112._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98
  ;
  auVar112._10_2_ =
       (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99;
  auVar112._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  auVar112._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  sVar82 = auVar133._0_2_;
  uVar88 = (ushort)(sVar135 < sVar82) * sVar135 | (ushort)(sVar135 >= sVar82) * sVar82;
  sVar82 = auVar133._2_2_;
  uVar95 = (ushort)(sVar137 < sVar82) * sVar137 | (ushort)(sVar137 >= sVar82) * sVar82;
  sVar82 = auVar133._4_2_;
  uVar96 = (ushort)(sVar138 < sVar82) * sVar138 | (ushort)(sVar138 >= sVar82) * sVar82;
  sVar82 = auVar133._6_2_;
  uVar97 = (ushort)(sVar139 < sVar82) * sVar139 | (ushort)(sVar139 >= sVar82) * sVar82;
  sVar82 = auVar133._8_2_;
  uVar98 = (ushort)(sVar140 < sVar82) * sVar140 | (ushort)(sVar140 >= sVar82) * sVar82;
  sVar82 = auVar133._10_2_;
  uVar99 = (ushort)(sVar141 < sVar82) * sVar141 | (ushort)(sVar141 >= sVar82) * sVar82;
  sVar82 = auVar133._12_2_;
  sVar87 = auVar133._14_2_;
  uVar100 = (ushort)(sVar142 < sVar82) * sVar142 | (ushort)(sVar142 >= sVar82) * sVar82;
  uVar101 = (ushort)(sVar143 < sVar87) * sVar143 | (ushort)(sVar143 >= sVar87) * sVar87;
  auVar93._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88;
  auVar93._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95;
  auVar93._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96;
  auVar93._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97;
  auVar93._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98;
  auVar93._10_2_ = (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99
  ;
  auVar93._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  auVar93._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  auVar134 = psraw(auVar112,3);
  auVar133 = psraw(auVar93,3);
  auVar102 = psubsw(auVar102,auVar134);
  sVar82 = auVar102._0_2_;
  uVar88 = (ushort)(sVar135 < sVar82) * sVar135 | (ushort)(sVar135 >= sVar82) * sVar82;
  sVar82 = auVar102._2_2_;
  uVar95 = (ushort)(sVar137 < sVar82) * sVar137 | (ushort)(sVar137 >= sVar82) * sVar82;
  sVar82 = auVar102._4_2_;
  uVar96 = (ushort)(sVar138 < sVar82) * sVar138 | (ushort)(sVar138 >= sVar82) * sVar82;
  sVar82 = auVar102._6_2_;
  uVar97 = (ushort)(sVar139 < sVar82) * sVar139 | (ushort)(sVar139 >= sVar82) * sVar82;
  sVar82 = auVar102._8_2_;
  uVar98 = (ushort)(sVar140 < sVar82) * sVar140 | (ushort)(sVar140 >= sVar82) * sVar82;
  sVar82 = auVar102._10_2_;
  uVar99 = (ushort)(sVar141 < sVar82) * sVar141 | (ushort)(sVar141 >= sVar82) * sVar82;
  sVar82 = auVar102._12_2_;
  sVar87 = auVar102._14_2_;
  uVar100 = (ushort)(sVar142 < sVar82) * sVar142 | (ushort)(sVar142 >= sVar82) * sVar82;
  uVar101 = (ushort)(sVar143 < sVar87) * sVar143 | (ushort)(sVar143 >= sVar87) * sVar87;
  auVar103._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88
  ;
  auVar103._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95
  ;
  auVar103._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96
  ;
  auVar103._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97
  ;
  auVar103._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98
  ;
  auVar103._10_2_ =
       (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99;
  auVar103._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  auVar103._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  auVar133 = paddsw(auVar133,auVar75);
  sVar82 = auVar133._0_2_;
  uVar88 = (ushort)(sVar135 < sVar82) * sVar135 | (ushort)(sVar135 >= sVar82) * sVar82;
  sVar82 = auVar133._2_2_;
  uVar95 = (ushort)(sVar137 < sVar82) * sVar137 | (ushort)(sVar137 >= sVar82) * sVar82;
  sVar82 = auVar133._4_2_;
  uVar96 = (ushort)(sVar138 < sVar82) * sVar138 | (ushort)(sVar138 >= sVar82) * sVar82;
  sVar82 = auVar133._6_2_;
  uVar97 = (ushort)(sVar139 < sVar82) * sVar139 | (ushort)(sVar139 >= sVar82) * sVar82;
  sVar82 = auVar133._8_2_;
  uVar98 = (ushort)(sVar140 < sVar82) * sVar140 | (ushort)(sVar140 >= sVar82) * sVar82;
  sVar82 = auVar133._10_2_;
  uVar99 = (ushort)(sVar141 < sVar82) * sVar141 | (ushort)(sVar141 >= sVar82) * sVar82;
  sVar82 = auVar133._12_2_;
  sVar87 = auVar133._14_2_;
  uVar100 = (ushort)(sVar142 < sVar82) * sVar142 | (ushort)(sVar142 >= sVar82) * sVar82;
  uVar101 = (ushort)(sVar143 < sVar87) * sVar143 | (ushort)(sVar143 >= sVar87) * sVar87;
  auVar94._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88;
  auVar94._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95;
  auVar94._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96;
  auVar94._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97;
  auVar94._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98;
  auVar94._10_2_ = (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99
  ;
  auVar94._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  auVar94._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  local_338 = paddsw(auVar103,auVar114);
  local_318 = paddsw(auVar94,auVar114);
  auVar113._0_2_ = auVar134._0_2_ + 1;
  auVar113._2_2_ = auVar134._2_2_ + 1;
  auVar113._4_2_ = auVar134._4_2_ + 1;
  auVar113._6_2_ = auVar134._6_2_ + 1;
  auVar113._8_2_ = auVar134._8_2_ + 1;
  auVar113._10_2_ = auVar134._10_2_ + 1;
  auVar113._12_2_ = auVar134._12_2_ + 1;
  auVar113._14_2_ = auVar134._14_2_ + 1;
  auVar133 = psraw(auVar113,1);
  auVar83 = psubsw(auVar83,~auVar117 & auVar133);
  sVar82 = auVar83._0_2_;
  uVar88 = (ushort)(sVar135 < sVar82) * sVar135 | (ushort)(sVar135 >= sVar82) * sVar82;
  sVar82 = auVar83._2_2_;
  uVar95 = (ushort)(sVar137 < sVar82) * sVar137 | (ushort)(sVar137 >= sVar82) * sVar82;
  sVar82 = auVar83._4_2_;
  uVar96 = (ushort)(sVar138 < sVar82) * sVar138 | (ushort)(sVar138 >= sVar82) * sVar82;
  sVar82 = auVar83._6_2_;
  uVar97 = (ushort)(sVar139 < sVar82) * sVar139 | (ushort)(sVar139 >= sVar82) * sVar82;
  sVar82 = auVar83._8_2_;
  uVar98 = (ushort)(sVar140 < sVar82) * sVar140 | (ushort)(sVar140 >= sVar82) * sVar82;
  sVar82 = auVar83._10_2_;
  uVar99 = (ushort)(sVar141 < sVar82) * sVar141 | (ushort)(sVar141 >= sVar82) * sVar82;
  sVar82 = auVar83._12_2_;
  sVar87 = auVar83._14_2_;
  uVar100 = (ushort)(sVar142 < sVar82) * sVar142 | (ushort)(sVar142 >= sVar82) * sVar82;
  uVar101 = (ushort)(sVar143 < sVar87) * sVar143 | (ushort)(sVar143 >= sVar87) * sVar87;
  auVar84._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88;
  auVar84._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95;
  auVar84._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96;
  auVar84._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97;
  auVar84._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98;
  auVar84._10_2_ = (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99
  ;
  auVar84._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  auVar84._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  auVar83 = paddsw(~auVar117 & auVar133,auVar79);
  sVar82 = auVar83._0_2_;
  uVar88 = (ushort)(sVar135 < sVar82) * sVar135 | (ushort)(sVar135 >= sVar82) * sVar82;
  sVar135 = auVar83._2_2_;
  uVar95 = (ushort)(sVar137 < sVar135) * sVar137 | (ushort)(sVar137 >= sVar135) * sVar135;
  sVar135 = auVar83._4_2_;
  uVar96 = (ushort)(sVar138 < sVar135) * sVar138 | (ushort)(sVar138 >= sVar135) * sVar135;
  sVar135 = auVar83._6_2_;
  uVar97 = (ushort)(sVar139 < sVar135) * sVar139 | (ushort)(sVar139 >= sVar135) * sVar135;
  sVar135 = auVar83._8_2_;
  uVar98 = (ushort)(sVar140 < sVar135) * sVar140 | (ushort)(sVar140 >= sVar135) * sVar135;
  sVar135 = auVar83._10_2_;
  uVar99 = (ushort)(sVar141 < sVar135) * sVar141 | (ushort)(sVar141 >= sVar135) * sVar135;
  sVar135 = auVar83._12_2_;
  sVar137 = auVar83._14_2_;
  uVar100 = (ushort)(sVar142 < sVar135) * sVar142 | (ushort)(sVar142 >= sVar135) * sVar135;
  uVar101 = (ushort)(sVar143 < sVar137) * sVar143 | (ushort)(sVar143 >= sVar137) * sVar137;
  auVar118._0_2_ = (ushort)((short)uVar88 < sVar104) * sVar104 | ((short)uVar88 >= sVar104) * uVar88
  ;
  auVar118._2_2_ = (ushort)((short)uVar95 < sVar105) * sVar105 | ((short)uVar95 >= sVar105) * uVar95
  ;
  auVar118._4_2_ = (ushort)((short)uVar96 < sVar106) * sVar106 | ((short)uVar96 >= sVar106) * uVar96
  ;
  auVar118._6_2_ = (ushort)((short)uVar97 < sVar107) * sVar107 | ((short)uVar97 >= sVar107) * uVar97
  ;
  auVar118._8_2_ = (ushort)((short)uVar98 < sVar108) * sVar108 | ((short)uVar98 >= sVar108) * uVar98
  ;
  auVar118._10_2_ =
       (ushort)((short)uVar99 < sVar109) * sVar109 | ((short)uVar99 >= sVar109) * uVar99;
  auVar118._12_2_ =
       (ushort)((short)uVar100 < sVar110) * sVar110 | ((short)uVar100 >= sVar110) * uVar100;
  auVar118._14_2_ =
       (ushort)((short)uVar101 < sVar111) * sVar111 | ((short)uVar101 >= sVar111) * uVar101;
  local_328 = paddsw(auVar84,auVar114);
  local_308 = paddsw(auVar118,auVar114);
  if ((((((((((((((((auVar120 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar120 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar120 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar120 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar120 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar120 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar120 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar120 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar120 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar120 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar120 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar120 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar120 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar120 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar120 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar120[0xf]) {
    local_288 = local_318._0_2_;
    sStack_286 = local_318._2_2_;
    sStack_284 = local_318._4_2_;
    sStack_282 = local_318._6_2_;
    sStack_280 = local_318._8_2_;
    sStack_27e = local_318._10_2_;
    sStack_27c = local_318._12_2_;
    sStack_27a = local_318._14_2_;
    local_2f8 = local_338._0_2_;
    sStack_2f6 = local_338._2_2_;
    sStack_2f4 = local_338._4_2_;
    sStack_2f2 = local_338._6_2_;
    sStack_2f0 = local_338._8_2_;
    sStack_2ee = local_338._10_2_;
    sStack_2ec = local_338._12_2_;
    sStack_2ea = local_338._14_2_;
    local_278 = local_308._0_2_;
    sStack_276 = local_308._2_2_;
    sStack_274 = local_308._4_2_;
    sStack_272 = local_308._6_2_;
    sStack_270 = local_308._8_2_;
    sStack_26e = local_308._10_2_;
    sStack_26c = local_308._12_2_;
    sStack_26a = local_308._14_2_;
    local_2e8 = local_328._0_2_;
    sStack_2e6 = local_328._2_2_;
    sStack_2e4 = local_328._4_2_;
    sStack_2e2 = local_328._6_2_;
    sStack_2e0 = local_328._8_2_;
    sStack_2de = local_328._10_2_;
    sStack_2dc = local_328._12_2_;
    sStack_2da = local_328._14_2_;
  }
  else {
    auVar83 = psubusw(auVar80,auVar125);
    auVar81._0_2_ = -(ushort)(auVar83._0_2_ == 0);
    auVar81._2_2_ = -(ushort)(auVar83._2_2_ == 0);
    auVar81._4_2_ = -(ushort)(auVar83._4_2_ == 0);
    auVar81._6_2_ = -(ushort)(auVar83._6_2_ == 0);
    auVar81._8_2_ = -(ushort)(auVar83._8_2_ == 0);
    auVar81._10_2_ = -(ushort)(auVar83._10_2_ == 0);
    auVar81._12_2_ = -(ushort)(auVar83._12_2_ == 0);
    auVar81._14_2_ = -(ushort)(auVar83._14_2_ == 0);
    sVar135 = local_278 + local_288 + local_268._0_2_;
    sVar137 = sStack_276 + sStack_286 + local_268._2_2_;
    sVar138 = sStack_274 + sStack_284 + local_268._4_2_;
    sVar139 = sStack_272 + sStack_282 + local_268._6_2_;
    sVar140 = sStack_270 + sStack_280 + local_268._8_2_;
    sVar141 = sStack_26e + sStack_27e + local_268._10_2_;
    sVar142 = sStack_26c + sStack_27c + local_268._12_2_;
    sVar143 = sStack_26a + sStack_27a + local_268._14_2_;
    local_128 = local_2e8 + local_2f8 + local_2d8._0_2_;
    sStack_126 = sStack_2e6 + sStack_2f6 + local_2d8._2_2_;
    sStack_124 = sStack_2e4 + sStack_2f4 + local_2d8._4_2_;
    sStack_122 = sStack_2e2 + sStack_2f2 + local_2d8._6_2_;
    sStack_120 = sStack_2e0 + sStack_2f0 + local_2d8._8_2_;
    sStack_11e = sStack_2de + sStack_2ee + local_2d8._10_2_;
    sStack_11c = sStack_2dc + sStack_2ec + local_2d8._12_2_;
    sStack_11a = sStack_2da + sStack_2ea + local_2d8._14_2_;
    local_158 = local_128 + sVar135;
    sStack_156 = sStack_126 + sVar137;
    sStack_154 = sStack_124 + sVar138;
    sStack_152 = sStack_122 + sVar139;
    sStack_150 = sStack_120 + sVar140;
    sStack_14e = sStack_11e + sVar141;
    sStack_14c = sStack_11c + sVar142;
    sStack_14a = sStack_11a + sVar143;
    sVar104 = local_158 + 4;
    sVar105 = sStack_156 + 4;
    sVar106 = sStack_154 + 4;
    sVar107 = sStack_152 + 4;
    sVar108 = sStack_150 + 4;
    sVar109 = sStack_14e + 4;
    sVar110 = sStack_14c + 4;
    sVar111 = sStack_14a + 4;
    local_138 = local_288;
    sStack_136 = sStack_286;
    sStack_134 = sStack_284;
    sStack_132 = sStack_282;
    sStack_130 = sStack_280;
    sStack_12e = sStack_27e;
    sStack_12c = sStack_27c;
    sStack_12a = sStack_27a;
    local_1d8 = (ushort)(local_288 + local_258 + sVar104) >> 3;
    uStack_1d6 = (ushort)(sStack_286 + sStack_256 + sVar105) >> 3;
    uStack_1d4 = (ushort)(sStack_284 + sStack_254 + sVar106) >> 3;
    uStack_1d2 = (ushort)(sStack_282 + sStack_252 + sVar107) >> 3;
    uStack_1d0 = (ushort)(sStack_280 + sStack_250 + sVar108) >> 3;
    uStack_1ce = (ushort)(sStack_27e + sStack_24e + sVar109) >> 3;
    uStack_1cc = (ushort)(sStack_27c + sStack_24c + sVar110) >> 3;
    uStack_1ca = (ushort)(sStack_27a + sStack_24a + sVar111) >> 3;
    local_148 = local_2f8;
    sStack_146 = sStack_2f6;
    sStack_144 = sStack_2f4;
    sStack_142 = sStack_2f2;
    sStack_140 = sStack_2f0;
    sStack_13e = sStack_2ee;
    sStack_13c = sStack_2ec;
    sStack_13a = sStack_2ea;
    local_208 = (ushort)(local_2f8 + local_2c8 + sVar104) >> 3;
    uStack_206 = (ushort)(sStack_2f6 + sStack_2c6 + sVar105) >> 3;
    uStack_204 = (ushort)(sStack_2f4 + sStack_2c4 + sVar106) >> 3;
    uStack_202 = (ushort)(sStack_2f2 + sStack_2c2 + sVar107) >> 3;
    uStack_200 = (ushort)(sStack_2f0 + sStack_2c0 + sVar108) >> 3;
    uStack_1fe = (ushort)(sStack_2ee + sStack_2be + sVar109) >> 3;
    uStack_1fc = (ushort)(sStack_2ec + sStack_2bc + sVar110) >> 3;
    uStack_1fa = (ushort)(sStack_2ea + sStack_2ba + sVar111) >> 3;
    local_1c8 = (ushort)(local_278 + local_258 * 2 + (sVar104 - local_2d8._0_2_)) >> 3;
    uStack_1c6 = (ushort)(sStack_276 + sStack_256 * 2 + (sVar105 - local_2d8._2_2_)) >> 3;
    uStack_1c4 = (ushort)(sStack_274 + sStack_254 * 2 + (sVar106 - local_2d8._4_2_)) >> 3;
    uStack_1c2 = (ushort)(sStack_272 + sStack_252 * 2 + (sVar107 - local_2d8._6_2_)) >> 3;
    uStack_1c0 = (ushort)(sStack_270 + sStack_250 * 2 + (sVar108 - local_2d8._8_2_)) >> 3;
    uStack_1be = (ushort)(sStack_26e + sStack_24e * 2 + (sVar109 - local_2d8._10_2_)) >> 3;
    uStack_1bc = (ushort)(sStack_26c + sStack_24c * 2 + (sVar110 - local_2d8._12_2_)) >> 3;
    uStack_1ba = (ushort)(sStack_26a + sStack_24a * 2 + (sVar111 - local_2d8._14_2_)) >> 3;
    local_1f8 = (ushort)(local_2e8 + local_2c8 * 2 + (sVar104 - local_268._0_2_)) >> 3;
    uStack_1f6 = (ushort)(sStack_2e6 + sStack_2c6 * 2 + (sVar105 - local_268._2_2_)) >> 3;
    uStack_1f4 = (ushort)(sStack_2e4 + sStack_2c4 * 2 + (sVar106 - local_268._4_2_)) >> 3;
    uStack_1f2 = (ushort)(sStack_2e2 + sStack_2c2 * 2 + (sVar107 - local_268._6_2_)) >> 3;
    uStack_1f0 = (ushort)(sStack_2e0 + sStack_2c0 * 2 + (sVar108 - local_268._8_2_)) >> 3;
    uStack_1ee = (ushort)(sStack_2de + sStack_2be * 2 + (sVar109 - local_268._10_2_)) >> 3;
    uStack_1ec = (ushort)(sStack_2dc + sStack_2bc * 2 + (sVar110 - local_268._12_2_)) >> 3;
    uStack_1ea = (ushort)(sStack_2da + sStack_2ba * 2 + (sVar111 - local_268._14_2_)) >> 3;
    local_108 = local_268._0_2_;
    sStack_106 = local_268._2_2_;
    sStack_104 = local_268._4_2_;
    sStack_102 = local_268._6_2_;
    sStack_100 = local_268._8_2_;
    sStack_fe = local_268._10_2_;
    sStack_fc = local_268._12_2_;
    sStack_fa = local_268._14_2_;
    local_f8 = local_2e8;
    sStack_f6 = sStack_2e6;
    sStack_f4 = sStack_2e4;
    sStack_f2 = sStack_2e2;
    sStack_f0 = sStack_2e0;
    sStack_ee = sStack_2de;
    sStack_ec = sStack_2dc;
    sStack_ea = sStack_2da;
    auVar81 = auVar81 & auVar120;
    local_1b8._2_2_ =
         (ushort)(((local_268._2_2_ + sStack_256 * 3) - sStack_2e6) + (sVar105 - local_2d8._2_2_))
         >> 3;
    local_1b8._0_2_ =
         (ushort)(((local_268._0_2_ + local_258 * 3) - local_2e8) + (sVar104 - local_2d8._0_2_)) >>
         3;
    local_1b8._4_2_ =
         (ushort)(((local_268._4_2_ + sStack_254 * 3) - sStack_2e4) + (sVar106 - local_2d8._4_2_))
         >> 3;
    local_1b8._6_2_ =
         (ushort)(((local_268._6_2_ + sStack_252 * 3) - sStack_2e2) + (sVar107 - local_2d8._6_2_))
         >> 3;
    local_1b8._8_2_ =
         (ushort)(((local_268._8_2_ + sStack_250 * 3) - sStack_2e0) + (sVar108 - local_2d8._8_2_))
         >> 3;
    local_1b8._10_2_ =
         (ushort)(((local_268._10_2_ + sStack_24e * 3) - sStack_2de) + (sVar109 - local_2d8._10_2_))
         >> 3;
    local_1b8._12_2_ =
         (ushort)(((local_268._12_2_ + sStack_24c * 3) - sStack_2dc) + (sVar110 - local_2d8._12_2_))
         >> 3;
    local_1b8._14_2_ =
         (ushort)(((local_268._14_2_ + sStack_24a * 3) - sStack_2da) + (sVar111 - local_2d8._14_2_))
         >> 3;
    local_118 = local_2d8._0_2_;
    sStack_116 = local_2d8._2_2_;
    sStack_114 = local_2d8._4_2_;
    sStack_112 = local_2d8._6_2_;
    sStack_110 = local_2d8._8_2_;
    sStack_10e = local_2d8._10_2_;
    sStack_10c = local_2d8._12_2_;
    sStack_10a = local_2d8._14_2_;
    local_1e8._2_2_ =
         (ushort)((sStack_2c6 * 3 - sStack_276) + local_2d8._2_2_ + (sVar105 - local_268._2_2_)) >>
         3;
    local_1e8._0_2_ =
         (ushort)((local_2c8 * 3 - local_278) + local_2d8._0_2_ + (sVar104 - local_268._0_2_)) >> 3;
    local_1e8._4_2_ =
         (ushort)((sStack_2c4 * 3 - sStack_274) + local_2d8._4_2_ + (sVar106 - local_268._4_2_)) >>
         3;
    local_1e8._6_2_ =
         (ushort)((sStack_2c2 * 3 - sStack_272) + local_2d8._6_2_ + (sVar107 - local_268._6_2_)) >>
         3;
    local_1e8._8_2_ =
         (ushort)((sStack_2c0 * 3 - sStack_270) + local_2d8._8_2_ + (sVar108 - local_268._8_2_)) >>
         3;
    local_1e8._10_2_ =
         (ushort)((sStack_2be * 3 - sStack_26e) + local_2d8._10_2_ + (sVar109 - local_268._10_2_))
         >> 3;
    local_1e8._12_2_ =
         (ushort)((sStack_2bc * 3 - sStack_26c) + local_2d8._12_2_ + (sVar110 - local_268._12_2_))
         >> 3;
    local_1e8._14_2_ =
         (ushort)((sStack_2ba * 3 - sStack_26a) + local_2d8._14_2_ + (sVar111 - local_268._14_2_))
         >> 3;
    if ((((((((((((((((auVar81 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar81 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar81 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar81 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar81 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar81 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar81 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar81 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar81 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar81 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar81 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar81 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar81[0xf] < '\0')
    {
      local_188 = local_248;
      sStack_186 = sStack_246;
      sStack_184 = sStack_244;
      sStack_182 = sStack_242;
      sStack_180 = sStack_240;
      sStack_17e = sStack_23e;
      sStack_17c = sStack_23c;
      sStack_17a = sStack_23a;
      local_1a8 = local_238;
      sStack_1a6 = sStack_236;
      sStack_1a4 = sStack_234;
      sStack_1a2 = sStack_232;
      sStack_1a0 = sStack_230;
      sStack_19e = sStack_22e;
      sStack_19c = sStack_22c;
      sStack_19a = sStack_22a;
      local_178 = local_248 + local_238 + local_258;
      sStack_176 = sStack_246 + sStack_236 + sStack_256;
      sStack_174 = sStack_244 + sStack_234 + sStack_254;
      sStack_172 = sStack_242 + sStack_232 + sStack_252;
      sStack_170 = sStack_240 + sStack_230 + sStack_250;
      sStack_16e = sStack_23e + sStack_22e + sStack_24e;
      sStack_16c = sStack_23c + sStack_22c + sStack_24c;
      sStack_16a = sStack_23a + sStack_22a + sStack_24a;
      local_198 = local_2b8;
      sStack_196 = sStack_2b6;
      sStack_194 = sStack_2b4;
      sStack_192 = sStack_2b2;
      sStack_190 = sStack_2b0;
      sStack_18e = sStack_2ae;
      sStack_18c = sStack_2ac;
      sStack_18a = sStack_2aa;
      local_168 = local_2a8 + local_2b8 + local_2c8;
      sStack_166 = sStack_2a6 + sStack_2b6 + sStack_2c6;
      sStack_164 = sStack_2a4 + sStack_2b4 + sStack_2c4;
      sStack_162 = sStack_2a2 + sStack_2b2 + sStack_2c2;
      sStack_160 = sStack_2a0 + sStack_2b0 + sStack_2c0;
      sStack_15e = sStack_29e + sStack_2ae + sStack_2be;
      sStack_15c = sStack_29c + sStack_2ac + sStack_2bc;
      sStack_15a = sStack_29a + sStack_2aa + sStack_2ba;
      local_218 = local_278;
      sStack_216 = sStack_276;
      sStack_214 = sStack_274;
      sStack_212 = sStack_272;
      sStack_210 = sStack_270;
      sStack_20e = sStack_26e;
      sStack_20c = sStack_26c;
      sStack_20a = sStack_26a;
      sVar123 = local_178 + local_168 + local_158 + 8;
      sVar126 = sStack_176 + sStack_166 + sStack_156 + 8;
      sVar127 = sStack_174 + sStack_164 + sStack_154 + 8;
      sVar128 = sStack_172 + sStack_162 + sStack_152 + 8;
      sVar129 = sStack_170 + sStack_160 + sStack_150 + 8;
      sVar130 = sStack_16e + sStack_15e + sStack_14e + 8;
      sVar131 = sStack_16c + sStack_15c + sStack_14c + 8;
      sVar132 = sStack_16a + sStack_15a + sStack_14a + 8;
      sVar82 = local_228._0_2_;
      sVar87 = local_228._2_2_;
      sVar121 = local_228._4_2_;
      sVar122 = local_228._6_2_;
      sVar104 = local_298._0_2_;
      sVar105 = local_298._2_2_;
      sVar106 = local_298._4_2_;
      sVar107 = local_298._6_2_;
      sVar108 = local_298._8_2_;
      sVar109 = local_298._10_2_;
      sVar110 = local_298._12_2_;
      sVar111 = local_298._14_2_;
      uStack_88 = (ushort)(local_278 + local_288 + local_2f8 + sVar82 + sVar123) >> 4;
      uStack_86 = (ushort)(sStack_276 + sStack_286 + sStack_2f6 + sVar87 + sVar126) >> 4;
      uStack_84 = (ushort)(sStack_274 + sStack_284 + sStack_2f4 + sVar121 + sVar127) >> 4;
      uStack_82 = (ushort)(sStack_272 + sStack_282 + sStack_2f2 + sVar122 + sVar128) >> 4;
      qs[0][0]._0_2_ =
           (ushort)(sStack_270 + sStack_280 + sStack_2f0 + local_228._8_2_ + sVar129) >> 4;
      qs[0][0]._2_2_ =
           (ushort)(sStack_26e + sStack_27e + sStack_2ee + local_228._10_2_ + sVar130) >> 4;
      qs[0][0]._4_2_ =
           (ushort)(sStack_26c + sStack_27c + sStack_2ec + local_228._12_2_ + sVar131) >> 4;
      qs[0][0]._6_2_ =
           (ushort)(sStack_26a + sStack_27a + sStack_2ea + local_228._14_2_ + sVar132) >> 4;
      local_e8 = (ushort)(local_2e8 + local_2f8 + local_288 + sVar104 + sVar123) >> 4;
      uStack_e6 = (ushort)(sStack_2e6 + sStack_2f6 + sStack_286 + sVar105 + sVar126) >> 4;
      uStack_e4 = (ushort)(sStack_2e4 + sStack_2f4 + sStack_284 + sVar106 + sVar127) >> 4;
      uStack_e2 = (ushort)(sStack_2e2 + sStack_2f2 + sStack_282 + sVar107 + sVar128) >> 4;
      uStack_e0 = (ushort)(sStack_2e0 + sStack_2f0 + sStack_280 + sVar108 + sVar129) >> 4;
      uStack_de = (ushort)(sStack_2de + sStack_2ee + sStack_27e + sVar109 + sVar130) >> 4;
      uStack_dc = (ushort)(sStack_2dc + sStack_2ec + sStack_27c + sVar110 + sVar131) >> 4;
      uStack_da = (ushort)(sStack_2da + sStack_2ea + sStack_27a + sVar111 + sVar132) >> 4;
      qs[0][1]._0_2_ = (ushort)(sVar135 + sVar82 * 2 + (sVar123 - local_2a8)) >> 4;
      qs[0][1]._2_2_ = (ushort)(sVar137 + sVar87 * 2 + (sVar126 - sStack_2a6)) >> 4;
      qs[0][1]._4_2_ = (ushort)(sVar138 + sVar121 * 2 + (sVar127 - sStack_2a4)) >> 4;
      qs[0][1]._6_2_ = (ushort)(sVar139 + sVar122 * 2 + (sVar128 - sStack_2a2)) >> 4;
      qs[1][0]._0_2_ = (ushort)(sVar140 + local_228._8_2_ * 2 + (sVar129 - sStack_2a0)) >> 4;
      qs[1][0]._2_2_ = (ushort)(sVar141 + local_228._10_2_ * 2 + (sVar130 - sStack_29e)) >> 4;
      qs[1][0]._4_2_ = (ushort)(sVar142 + local_228._12_2_ * 2 + (sVar131 - sStack_29c)) >> 4;
      qs[1][0]._6_2_ = (ushort)(sVar143 + local_228._14_2_ * 2 + (sVar132 - sStack_29a)) >> 4;
      local_d8 = (ushort)(local_128 + sVar104 * 2 + (sVar123 - local_238)) >> 4;
      uStack_d6 = (ushort)(sStack_126 + sVar105 * 2 + (sVar126 - sStack_236)) >> 4;
      uStack_d4 = (ushort)(sStack_124 + sVar106 * 2 + (sVar127 - sStack_234)) >> 4;
      uStack_d2 = (ushort)(sStack_122 + sVar107 * 2 + (sVar128 - sStack_232)) >> 4;
      uStack_d0 = (ushort)(sStack_120 + sVar108 * 2 + (sVar129 - sStack_230)) >> 4;
      uStack_ce = (ushort)(sStack_11e + sVar109 * 2 + (sVar130 - sStack_22e)) >> 4;
      uStack_cc = (ushort)(sStack_11c + sVar110 * 2 + (sVar131 - sStack_22c)) >> 4;
      uStack_ca = (ushort)(sStack_11a + sVar111 * 2 + (sVar132 - sStack_22a)) >> 4;
      qs[1][1]._0_2_ =
           (ushort)(local_278 + local_268._0_2_ + local_258 + sVar82 * 3 +
                   ((sVar123 - local_2a8) - local_2b8)) >> 4;
      qs[1][1]._2_2_ =
           (ushort)(sStack_276 + local_268._2_2_ + sStack_256 + sVar87 * 3 +
                   ((sVar126 - sStack_2a6) - sStack_2b6)) >> 4;
      qs[1][1]._4_2_ =
           (ushort)(sStack_274 + local_268._4_2_ + sStack_254 + sVar121 * 3 +
                   ((sVar127 - sStack_2a4) - sStack_2b4)) >> 4;
      qs[1][1]._6_2_ =
           (ushort)(sStack_272 + local_268._6_2_ + sStack_252 + sVar122 * 3 +
                   ((sVar128 - sStack_2a2) - sStack_2b2)) >> 4;
      sVar135 = (sVar123 - local_238) - local_248;
      sVar137 = (sVar126 - sStack_236) - sStack_246;
      sVar138 = (sVar127 - sStack_234) - sStack_244;
      sVar139 = (sVar128 - sStack_232) - sStack_242;
      sVar140 = (sVar129 - sStack_230) - sStack_240;
      sVar141 = (sVar130 - sStack_22e) - sStack_23e;
      sVar142 = (sVar131 - sStack_22c) - sStack_23c;
      sVar143 = (sVar132 - sStack_22a) - sStack_23a;
      local_c8 = (ushort)(local_2e8 + local_2d8._0_2_ + local_2c8 + sVar104 * 3 + sVar135) >> 4;
      uStack_c6 = (ushort)(sStack_2e6 + local_2d8._2_2_ + sStack_2c6 + sVar105 * 3 + sVar137) >> 4;
      uStack_c4 = (ushort)(sStack_2e4 + local_2d8._4_2_ + sStack_2c4 + sVar106 * 3 + sVar138) >> 4;
      uStack_c2 = (ushort)(sStack_2e2 + local_2d8._6_2_ + sStack_2c2 + sVar107 * 3 + sVar139) >> 4;
      uStack_c0 = (ushort)(sStack_2e0 + local_2d8._8_2_ + sStack_2c0 + sVar108 * 3 + sVar140) >> 4;
      uStack_be = (ushort)(sStack_2de + local_2d8._10_2_ + sStack_2be + sVar109 * 3 + sVar141) >> 4;
      uStack_bc = (ushort)(sStack_2dc + local_2d8._12_2_ + sStack_2bc + sVar110 * 3 + sVar142) >> 4;
      uStack_ba = (ushort)(sStack_2da + local_2d8._14_2_ + sStack_2ba + sVar111 * 3 + sVar143) >> 4;
      sVar135 = sVar135 - local_258;
      sVar137 = sVar137 - sStack_256;
      sVar138 = sVar138 - sStack_254;
      sVar139 = sVar139 - sStack_252;
      sVar140 = sVar140 - sStack_250;
      sVar141 = sVar141 - sStack_24e;
      sVar142 = sVar142 - sStack_24c;
      sVar143 = sVar143 - sStack_24a;
      psllw(local_228,2);
      auVar83 = psllw(local_298,2);
      local_b8 = (ushort)(local_2c8 + local_2b8 + local_2d8._0_2_ + auVar83._0_2_ + sVar135) >> 4;
      uStack_b6 = (ushort)(sStack_2c6 + sStack_2b6 + local_2d8._2_2_ + auVar83._2_2_ + sVar137) >> 4
      ;
      uStack_b4 = (ushort)(sStack_2c4 + sStack_2b4 + local_2d8._4_2_ + auVar83._4_2_ + sVar138) >> 4
      ;
      uStack_b2 = (ushort)(sStack_2c2 + sStack_2b2 + local_2d8._6_2_ + auVar83._6_2_ + sVar139) >> 4
      ;
      uStack_b0 = (ushort)(sStack_2c0 + sStack_2b0 + local_2d8._8_2_ + auVar83._8_2_ + sVar140) >> 4
      ;
      uStack_ae = (ushort)(sStack_2be + sStack_2ae + local_2d8._10_2_ + auVar83._10_2_ + sVar141) >>
                  4;
      uStack_ac = (ushort)(sStack_2bc + sStack_2ac + local_2d8._12_2_ + auVar83._12_2_ + sVar142) >>
                  4;
      uStack_aa = (ushort)(sStack_2ba + sStack_2aa + local_2d8._14_2_ + auVar83._14_2_ + sVar143) >>
                  4;
      sVar135 = sVar135 - local_268._0_2_;
      sVar137 = sVar137 - local_268._2_2_;
      sVar138 = sVar138 - local_268._4_2_;
      sVar139 = sVar139 - local_268._6_2_;
      sVar140 = sVar140 - local_268._8_2_;
      sVar141 = sVar141 - local_268._10_2_;
      sVar142 = sVar142 - local_268._12_2_;
      sVar143 = sVar143 - local_268._14_2_;
      local_a8 = (ushort)(auVar83._0_2_ + sVar104 + local_168 + sVar135) >> 4;
      uStack_a6 = (ushort)(auVar83._2_2_ + sVar105 + sStack_166 + sVar137) >> 4;
      uStack_a4 = (ushort)(auVar83._4_2_ + sVar106 + sStack_164 + sVar138) >> 4;
      uStack_a2 = (ushort)(auVar83._6_2_ + sVar107 + sStack_162 + sVar139) >> 4;
      uStack_a0 = (ushort)(auVar83._8_2_ + sVar108 + sStack_160 + sVar140) >> 4;
      uStack_9e = (ushort)(auVar83._10_2_ + sVar109 + sStack_15e + sVar141) >> 4;
      uStack_9c = (ushort)(auVar83._12_2_ + sVar110 + sStack_15c + sVar142) >> 4;
      uStack_9a = (ushort)(auVar83._14_2_ + sVar111 + sStack_15a + sVar143) >> 4;
      local_98 = (ushort)(((local_2a8 + local_2b8) - local_278) + sVar104 * 7 + sVar135) >> 4;
      uStack_96 = (ushort)(((sStack_2a6 + sStack_2b6) - sStack_276) + sVar105 * 7 + sVar137) >> 4;
      uStack_94 = (ushort)(((sStack_2a4 + sStack_2b4) - sStack_274) + sVar106 * 7 + sVar138) >> 4;
      uStack_92 = (ushort)(((sStack_2a2 + sStack_2b2) - sStack_272) + sVar107 * 7 + sVar139) >> 4;
      uStack_90 = (ushort)(((sStack_2a0 + sStack_2b0) - sStack_270) + sVar108 * 7 + sVar140) >> 4;
      uStack_8e = (ushort)(((sStack_29e + sStack_2ae) - sStack_26e) + sVar109 * 7 + sVar141) >> 4;
      uStack_8c = (ushort)(((sStack_29c + sStack_2ac) - sStack_26c) + sVar110 * 7 + sVar142) >> 4;
      uStack_8a = (ushort)(((sStack_29a + sStack_2aa) - sStack_26a) + sVar111 * 7 + sVar143) >> 4;
    }
    auVar85._8_4_ = 0xffffffff;
    auVar85._0_8_ = 0xffffffffffffffff;
    auVar85._12_4_ = 0xffffffff;
    uVar71 = (ulong)(uint)(0 << bVar1);
    do {
      auVar83 = *(undefined1 (*) [16])(local_318 + uVar71) & (auVar85 ^ auVar120);
      *(undefined1 (*) [16])(local_318 + uVar71) = auVar83;
      auVar133 = *(undefined1 (*) [16])((long)&local_1d8 + uVar71) & auVar120;
      *(undefined1 (*) [16])((long)&local_1d8 + uVar71) = auVar133;
      *(undefined1 (*) [16])((long)&local_288 + uVar71) = auVar133 | auVar83;
      auVar83 = *(undefined1 (*) [16])(local_338 + uVar71) & (auVar85 ^ auVar120);
      *(undefined1 (*) [16])(local_338 + uVar71) = auVar83;
      auVar133 = *(undefined1 (*) [16])((long)&local_208 + uVar71) & auVar120;
      *(undefined1 (*) [16])((long)&local_208 + uVar71) = auVar133;
      *(undefined1 (*) [16])((long)&local_2f8 + uVar71) = auVar133 | auVar83;
      uVar71 = uVar71 + 0x10;
    } while (uVar71 == 0x10);
    auVar86._8_4_ = 0xffffffff;
    auVar86._0_8_ = 0xffffffffffffffff;
    auVar86._12_4_ = 0xffffffff;
    local_1b8 = local_1b8 & auVar120;
    local_268 = local_1b8 | ~auVar120 & local_268;
    local_1e8 = local_1e8 & auVar120;
    local_2d8 = local_1e8 | ~auVar120 & local_2d8;
    lVar73 = 0;
    do {
      auVar83 = *(undefined1 (*) [16])(local_318 + lVar73) & (auVar86 ^ auVar120);
      *(undefined1 (*) [16])(local_318 + lVar73) = auVar83;
      auVar133 = *(undefined1 (*) [16])((long)&local_1d8 + lVar73) & auVar120;
      *(undefined1 (*) [16])((long)&local_1d8 + lVar73) = auVar133;
      *(undefined1 (*) [16])((long)&local_288 + lVar73) = auVar133 | auVar83;
      auVar83 = *(undefined1 (*) [16])(local_338 + lVar73) & (auVar86 ^ auVar120);
      *(undefined1 (*) [16])(local_338 + lVar73) = auVar83;
      auVar133 = *(undefined1 (*) [16])((long)&local_208 + lVar73) & auVar120;
      *(undefined1 (*) [16])((long)&local_208 + lVar73) = auVar133;
      *(undefined1 (*) [16])((long)&local_2f8 + lVar73) = auVar133 | auVar83;
      lVar73 = lVar73 + 0x10;
    } while (lVar73 == 0x10);
    if ((((((((((((((((auVar81 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar81 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar81 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar81 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar81 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar81 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar81 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar81 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar81 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar81 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar81 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar81 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar81[0xf] < '\0')
    {
      auVar78._8_4_ = 0xffffffff;
      auVar78._0_8_ = 0xffffffffffffffff;
      auVar78._12_4_ = 0xffffffff;
      lVar73 = 0;
      do {
        auVar83 = *(undefined1 (*) [16])((long)&uStack_88 + lVar73) & auVar81;
        *(undefined1 (*) [16])((long)&uStack_88 + lVar73) = auVar83;
        *(undefined1 (*) [16])((long)&local_288 + lVar73) =
             auVar83 | *(undefined1 (*) [16])((long)&local_288 + lVar73) & (auVar78 ^ auVar81);
        auVar83 = *(undefined1 (*) [16])((long)&local_e8 + lVar73) & auVar81;
        *(undefined1 (*) [16])((long)&local_e8 + lVar73) = auVar83;
        *(undefined1 (*) [16])((long)&local_2f8 + lVar73) =
             auVar83 | *(undefined1 (*) [16])((long)&local_2f8 + lVar73) & (auVar78 ^ auVar81);
        lVar73 = lVar73 + 0x10;
      } while (lVar73 != 0x60);
    }
  }
  puVar70 = s + -lVar69;
  lVar73 = 0;
  do {
    uVar49 = *(undefined8 *)((long)&sStack_280 + lVar73);
    *(undefined8 *)puVar70 = *(undefined8 *)((long)&local_288 + lVar73);
    *(undefined8 *)(puVar70 + 4) = uVar49;
    uVar49 = *(undefined8 *)((long)&sStack_2f0 + lVar73);
    *(undefined8 *)s = *(undefined8 *)((long)&local_2f8 + lVar73);
    *(undefined8 *)(s + 4) = uVar49;
    puVar70 = puVar70 + -lVar69;
    s = s + lVar69;
    lVar73 = lVar73 + 0x10;
  } while (lVar73 != 0x60);
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p[7], q[7];
  int i;
  load_highbd_pixel(s, 7, pitch, p, q);

  highbd_lpf_internal_14_dual_sse2(p, q, _blimit0, _limit0, _thresh0, _blimit1,
                                   _limit1, _thresh1, bd);

  for (i = 0; i < 6; i++) {
    _mm_storeu_si128((__m128i *)(s - (i + 1) * pitch), p[i]);
    _mm_storeu_si128((__m128i *)(s + i * pitch), q[i]);
  }
}